

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPrettyPrinter.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1e5ebb::TestcaseBase::TestcaseBase(TestcaseBase *this)

{
  OstreamBuffer *in_RDI;
  ostream *in_stack_ffffffffffffffd8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)in_RDI);
  binlog::detail::OstreamBuffer::OstreamBuffer(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TestcaseBase()
  {
    std::ostringstream argsBufferStream;
    mserialize::serialize(111, argsBufferStream);
    mserialize::serialize(std::string("foo"), argsBufferStream);
    argsBuffer = argsBufferStream.str();
    event.arguments = binlog::Range(argsBuffer.data(), argsBuffer.data() + argsBuffer.size());
  }